

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_broadcast(lws_context_per_thread *pt,int reason,void *in,size_t len)

{
  lws *plVar1;
  int iVar2;
  lws_protocols *plVar3;
  int iVar4;
  lws_vhost *plVar5;
  int iVar6;
  
  plVar5 = pt->context->vhost_list;
  pt->fake_wsi->context = pt->context;
  if (plVar5 == (lws_vhost *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      plVar3 = plVar5->protocols;
      pt->fake_wsi->vhost = plVar5;
      iVar2 = plVar5->count_protocols;
      if (0 < iVar2) {
        iVar6 = 0;
        do {
          plVar1 = pt->fake_wsi;
          plVar1->protocol = plVar3;
          if (plVar3->callback != (lws_callback_function *)0x0) {
            iVar2 = (*plVar3->callback)(plVar1,reason,(void *)0x0,in,len);
            if (iVar2 != 0) {
              iVar4 = 1;
            }
            iVar2 = plVar5->count_protocols;
          }
          plVar3 = plVar3 + 1;
          iVar6 = iVar6 + 1;
        } while (iVar6 < iVar2);
      }
      plVar5 = plVar5->vhost_next;
    } while (plVar5 != (lws_vhost *)0x0);
  }
  return iVar4;
}

Assistant:

int
lws_broadcast(struct lws_context_per_thread *pt, int reason, void *in, size_t len)
{
	struct lws_vhost *v = pt->context->vhost_list;
	int n, ret = 0;

	pt->fake_wsi->context = pt->context;

	while (v) {
		const struct lws_protocols *p = v->protocols;
		pt->fake_wsi->vhost = v; /* not a real bound wsi */

		for (n = 0; n < v->count_protocols; n++) {
			pt->fake_wsi->protocol = p;
			if (p->callback &&
			    p->callback(pt->fake_wsi, reason, NULL, in, len))
				ret |= 1;
			p++;
		}
		v = v->vhost_next;
	}

	return ret;
}